

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase35::run(TestCase35 *this)

{
  size_t sVar1;
  Builder builder_00;
  Builder builder_01;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  MessageSizeCounts MVar3;
  ReaderOptions options;
  unsigned_long local_330;
  Fault f;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  WordCountN<61,_uint64_t> local_2d0;
  uint local_2c8;
  Builder local_2c0;
  Builder local_298;
  Reader local_270;
  Reader local_240;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  MallocMessageBuilder builder;
  SegmentArrayMessageReader reader;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_298,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_298._builder.capTable;
  builder_00._builder.segment = local_298._builder.segment;
  builder_00._builder.data = local_298._builder.data;
  builder_00._builder.pointers = local_298._builder.pointers;
  builder_00._builder.dataSize = local_298._builder.dataSize;
  builder_00._builder.pointerCount = local_298._builder.pointerCount;
  builder_00._builder._38_2_ = local_298._builder._38_2_;
  initTestMessage(builder_00);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2c0,&builder.super_MessageBuilder);
  builder_01._builder.capTable = local_2c0._builder.capTable;
  builder_01._builder.segment = local_2c0._builder.segment;
  builder_01._builder.data = local_2c0._builder.data;
  builder_01._builder.pointers = local_2c0._builder.pointers;
  builder_01._builder.dataSize = local_2c0._builder.dataSize;
  builder_01._builder.pointerCount = local_2c0._builder.pointerCount;
  builder_01._builder._38_2_ = local_2c0._builder._38_2_;
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  StructBuilder::asReader((StructBuilder *)&reader);
  reader_00._reader.capTable = (CapTableReader *)uStack_208;
  reader_00._reader.segment = (SegmentReader *)local_210;
  reader_00._reader.data = (void *)local_200;
  reader_00._reader.pointers = (WirePointer *)uStack_1f8;
  reader_00._reader.dataSize = (undefined4)local_1f0;
  reader_00._reader.pointerCount = local_1f0._4_2_;
  reader_00._reader._38_2_ = local_1f0._6_2_;
  reader_00._reader._40_8_ = uStack_1e8;
  checkTestMessage(reader_00);
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,AVar2,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_240,&reader.super_MessageReader);
  reader_01._reader.capTable = local_240._reader.capTable;
  reader_01._reader.segment = local_240._reader.segment;
  reader_01._reader.data = local_240._reader.data;
  reader_01._reader.pointers = local_240._reader.pointers;
  reader_01._reader.dataSize = local_240._reader.dataSize;
  reader_01._reader.pointerCount = local_240._reader.pointerCount;
  reader_01._reader._38_2_ = local_240._reader._38_2_;
  reader_01._reader.nestingLimit = local_240._reader.nestingLimit;
  reader_01._reader._44_4_ = local_240._reader._44_4_;
  checkTestMessage(reader_01);
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  _kjCondition.right = AVar2.size_;
  _kjCondition.left = 1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 1;
  if (_kjCondition.result) {
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    readMessageUnchecked<capnproto_test::capnp::test::TestAllTypes>(&local_270,(AVar2.ptr)->ptr);
    reader_02._reader.capTable = local_270._reader.capTable;
    reader_02._reader.segment = local_270._reader.segment;
    reader_02._reader.data = local_270._reader.data;
    reader_02._reader.pointers = local_270._reader.pointers;
    reader_02._reader.dataSize = local_270._reader.dataSize;
    reader_02._reader.pointerCount = local_270._reader.pointerCount;
    reader_02._reader._38_2_ = local_270._reader._38_2_;
    reader_02._reader.nestingLimit = local_270._reader.nestingLimit;
    reader_02._reader._44_4_ = local_270._reader._44_4_;
    checkTestMessage(reader_02);
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    sVar1 = (AVar2.ptr)->size_;
    MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Reader *)&_kjCondition,&reader.super_MessageReader);
    MVar3 = StructReader::totalSize((StructReader *)&_kjCondition);
    f.exception = (Exception *)(sVar1 - 1);
    if ((f.exception != (Exception *)MVar3.wordCount) && (kj::_::Debug::minSeverity < 3)) {
      AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
      local_330 = (AVar2.ptr)->size_ - 1;
      MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
                ((Reader *)&_kjCondition,&reader.super_MessageReader);
      MVar3 = StructReader::totalSize((StructReader *)&_kjCondition);
      local_2d0 = MVar3.wordCount;
      local_2c8 = MVar3.capCount;
      kj::_::Debug::
      log<char_const(&)[122],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x33,ERROR,
                 "\"failed: expected \" \"(builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)\", _kjCondition, builder.getSegmentsForOutput()[0].size() - 1, reader.getRoot<TestAllTypes>().totalSize().wordCount"
                 ,(char (*) [122])
                  "failed: expected (builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)&f,&local_330,&local_2d0);
    }
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_330 = CONCAT44(local_330._4_4_,1);
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  local_2d0 = AVar2.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2e,FAILED,"(1u) == (builder.getSegmentsForOutput().size())",
             "_kjCondition,1u, builder.getSegmentsForOutput().size()",&_kjCondition,
             (uint *)&local_330,&local_2d0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, AllTypes) {
  MallocMessageBuilder builder;

  initTestMessage(builder.initRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>().asReader());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());

  checkTestMessage(reader.getRoot<TestAllTypes>());

  ASSERT_EQ(1u, builder.getSegmentsForOutput().size());

  checkTestMessage(readMessageUnchecked<TestAllTypes>(builder.getSegmentsForOutput()[0].begin()));

  EXPECT_EQ(builder.getSegmentsForOutput()[0].size() - 1,  // -1 for root pointer
            reader.getRoot<TestAllTypes>().totalSize().wordCount);
}